

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::
     log<char_const(&)[50],kj::_::DebugComparison<kj::ArrayPtr<int>,kj::ArrayPtr<int>>&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [50],
               DebugComparison<kj::ArrayPtr<int>,_kj::ArrayPtr<int>_> *params_1)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  long lVar3;
  String argValues [2];
  ArrayPtr<kj::String> in_stack_ffffffffffffff88;
  undefined8 auStack_68 [5];
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  str<char_const(&)[50]>
            ((String *)&stack0xffffffffffffff88,(kj *)params,
             (char (*) [50])CONCAT44(in_register_00000014,severity));
  _::operator*(&local_40,params_1);
  auStack_68[1] = local_40;
  auStack_68[2] = local_38;
  auStack_68[3] = uStack_30;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              &stack0xffffffffffffff88,in_stack_ffffffffffffff88);
  lVar3 = 0x18;
  do {
    lVar1 = *(long *)(&stack0xffffffffffffff88 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)(&stack0xffffffffffffff90 + lVar3);
      *(undefined8 *)(&stack0xffffffffffffff88 + lVar3) = 0;
      *(undefined8 *)(&stack0xffffffffffffff90 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)auStack_68 + lVar3))
                (*(undefined8 **)((long)auStack_68 + lVar3),lVar1,1,uVar2,uVar2,0);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}